

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_polar_codes.cpp
# Opt level: O3

void lzham::generate_polar_codes
               (uint num_syms,sym_freq_conflict *pSF,uint8 *pCodesizes,uint *max_code_size_ret)

{
  uint uVar1;
  ushort uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint auStack_978 [600];
  
  if (num_syms == 0) {
    bVar3 = 0xff;
    uVar9 = 0;
    uVar7 = 0;
  }
  else {
    uVar8 = num_syms - 1;
    uVar5 = 0;
    uVar9 = 0;
    uVar7 = 0;
    do {
      uVar2 = pSF[uVar8].m_freq;
      uVar9 = uVar9 + uVar2;
      iVar4 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar6 = 1 << ((byte)iVar4 & 0x1f);
      auStack_978[uVar5] = uVar6;
      uVar7 = uVar7 + uVar6;
      uVar5 = uVar5 + 1;
      uVar8 = uVar8 - 1;
    } while (num_syms != uVar5);
    iVar4 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    bVar3 = -(uVar9 == 0) | (byte)iVar4;
  }
  uVar6 = 1 << (bVar3 & 0x1f);
  uVar8 = 2 << (bVar3 & 0x1f);
  if (uVar9 <= uVar6) {
    uVar8 = uVar6;
  }
  if (num_syms == 0 || uVar8 <= uVar7) {
    uVar7 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    iVar4 = (uVar7 ^ 0xffffffe0) + 0x21;
    if (uVar8 == 0) {
      iVar4 = 0;
    }
    if (num_syms == 0) {
      uVar7 = 0;
      goto LAB_0011fe62;
    }
  }
  else {
    uVar6 = 0;
    uVar9 = 0;
    do {
      uVar1 = auStack_978[uVar9] + uVar7;
      if (uVar8 < uVar1) {
        uVar6 = uVar9 + 1;
      }
      else {
        auStack_978[uVar9] = auStack_978[uVar9] * 2;
        uVar7 = uVar1;
        if (uVar1 == uVar8) break;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 < num_syms) || ((uVar7 < uVar8 && (uVar9 = uVar6, uVar6 < num_syms))));
    uVar7 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    iVar4 = (uVar7 ^ 0xffffffe0) + 0x21;
  }
  uVar9 = num_syms - 1;
  uVar5 = 0;
  uVar7 = 0;
  do {
    uVar8 = auStack_978[uVar5];
    uVar6 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = ~uVar6 | 0xffffffe0;
    if (uVar8 == 0) {
      uVar6 = 0;
    }
    uVar6 = uVar6 + iVar4;
    if (uVar7 < uVar6) {
      uVar7 = uVar6;
    }
    pCodesizes[pSF[uVar9].m_sym] = (uint8)uVar6;
    uVar5 = uVar5 + 1;
    uVar9 = uVar9 - 1;
  } while (num_syms != uVar5);
LAB_0011fe62:
  *max_code_size_ret = uVar7;
  return;
}

Assistant:

void generate_polar_codes(uint num_syms, sym_freq* pSF, uint8* pCodesizes, uint& max_code_size_ret)
   {
      int tmp_freq[cPolarMaxSupportedSyms];

      uint orig_total_freq = 0;
      uint cur_total = 0;
      for (uint i = 0; i < num_syms; i++) 
      {
         uint sym_freq = pSF[num_syms - 1 - i].m_freq;
         orig_total_freq += sym_freq;

         uint sym_len = math::total_bits(sym_freq);
         uint adjusted_sym_freq = 1 << (sym_len - 1);
         tmp_freq[i] = adjusted_sym_freq;
         cur_total += adjusted_sym_freq;
      }

      uint tree_total = 1 << (math::total_bits(orig_total_freq) - 1);
      if (tree_total < orig_total_freq)
         tree_total <<= 1;

      uint start_index = 0;
      while ((cur_total < tree_total) && (start_index < num_syms))
      {
         for (uint i = start_index; i < num_syms; i++) 
         {
            uint freq = tmp_freq[i];
            if ((cur_total + freq) <= tree_total) 
            {
               tmp_freq[i] += freq;
               if ((cur_total += freq) == tree_total)
                  break;
            }
            else 
            {
               start_index = i + 1;
            }
         }
      }         

      LZHAM_ASSERT(cur_total == tree_total);

      uint max_code_size = 0;
      const uint tree_total_bits = math::total_bits(tree_total);
      for (uint i = 0; i < num_syms; i++) 
      {
         uint codesize = (tree_total_bits - math::total_bits(tmp_freq[i]));
         max_code_size = LZHAM_MAX(codesize, max_code_size);
         pCodesizes[pSF[num_syms-1-i].m_sym] = static_cast<uint8>(codesize);
      }
      max_code_size_ret = max_code_size;
   }